

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<1U>::
impl<void_(AbstractModuleClient::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<void,_AbstractModuleClient_&>_>
::operator()(impl<void_(AbstractModuleClient::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<void,_AbstractModuleClient_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyObject *pPVar1;
  c_t0 c0;
  arg_lvalue_from_python_base local_20;
  undefined4 local_14;
  
  converter::reference_arg_from_python<AbstractModuleClient_&>::reference_arg_from_python
            ((reference_arg_from_python<AbstractModuleClient_&> *)&local_20,
             (PyObject *)args_[1].ob_type);
  if (local_20.m_result == (void *)0x0) {
    pPVar1 = (PyObject *)0x0;
  }
  else {
    local_14 = 0;
    pPVar1 = invoke<int,void(AbstractModuleClient::*)(),boost::python::arg_from_python<AbstractModuleClient&>>
                       (&local_14,this,&local_20);
  }
  return pPVar1;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }